

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_write_nonblock.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  in_addr_t iVar3;
  uint uVar4;
  int __fd;
  int iVar5;
  FILE *__stream;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  time_t tVar10;
  ulong uVar11;
  time_t tVar12;
  fd_set *__writefds;
  undefined1 *__ptr;
  fd_set *__readfds;
  long lVar13;
  timeval timeout;
  sockaddr_in sin;
  stat fileinfo;
  char mem [102400];
  long lStack_191a0;
  size_t sStack_19198;
  int iStack_19180;
  timeval tStack_19168;
  fd_set fStack_19158;
  sockaddr sStack_190d8;
  stat sStack_190c8;
  undefined1 auStack_19038 [102408];
  
  iVar3 = 0x100007f;
  if (1 < argc) {
    iVar3 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    loclfile = argv[4];
  }
  if (5 < argc) {
    scppath = argv[5];
  }
  uVar4 = libssh2_init(0);
  if (uVar4 == 0) {
    __stream = fopen(loclfile,"rb");
    if (__stream != (FILE *)0x0) {
      stat(loclfile,&sStack_190c8);
      __fd = socket(2,1,0);
      if (__fd == -1) {
        main_cold_5();
      }
      else {
        sStack_190d8.sa_family = 2;
        sStack_190d8.sa_data[0] = '\0';
        sStack_190d8.sa_data[1] = '\x16';
        sStack_190d8.sa_data._2_4_ = iVar3;
        iVar5 = connect(__fd,&sStack_190d8,0x10);
        if (iVar5 == 0) {
          lVar6 = libssh2_session_init_ex(0,0,0,0);
          if (lVar6 != 0) {
            libssh2_session_set_blocking(lVar6,0);
            do {
              uVar4 = libssh2_session_handshake(lVar6,__fd);
            } while (uVar4 == 0xffffffdb);
            if (uVar4 == 0) {
              lVar7 = libssh2_hostkey_hash(lVar6,2);
              fwrite("Fingerprint: ",0xd,1,_stderr);
              lVar13 = 0;
              do {
                fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar7 + lVar13));
                lVar13 = lVar13 + 1;
              } while (lVar13 != 0x14);
              fputc(10,_stderr);
              do {
                pcVar1 = username;
                sVar8 = strlen(username);
                pcVar2 = password;
                sVar9 = strlen(password);
                iVar5 = libssh2_userauth_password_ex
                                  (lVar6,pcVar1,sVar8 & 0xffffffff,pcVar2,sVar9 & 0xffffffff,0);
              } while (iVar5 == -0x25);
              if (iVar5 == 0) {
                do {
                  lVar7 = libssh2_scp_send_ex(lVar6,scppath,sStack_190c8.st_mode & 0x1ff,
                                              sStack_190c8.st_size,0,0);
                  if (lVar7 != 0) {
                    fwrite("SCP session waiting to send file\n",0x21,1,_stderr);
                    tVar10 = time((time_t *)0x0);
                    iVar5 = __fd + 0x3f;
                    if (-1 < __fd) {
                      iVar5 = __fd;
                    }
                    lStack_191a0 = 0;
                    goto LAB_0010177a;
                  }
                  iVar5 = libssh2_session_last_errno(lVar6);
                } while (iVar5 == -0x25);
                main_cold_2();
              }
              else {
                main_cold_3();
              }
            }
            else {
              fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
            }
            goto LAB_00101545;
          }
          main_cold_4();
        }
        else {
          main_cold_1();
        }
      }
      lVar6 = 0;
      goto LAB_00101545;
    }
    main_cold_6();
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
  }
  return 1;
LAB_0010177a:
  do {
    __ptr = auStack_19038;
    sVar8 = fread(__ptr,1,0x19000,__stream);
    if (sVar8 == 0) break;
    lStack_191a0 = lStack_191a0 + sVar8;
    sStack_19198 = 0;
    do {
      sVar9 = sVar8;
      lVar13 = libssh2_channel_write_ex(lVar7,0,__ptr);
      if (lVar13 == -0x25) {
        do {
          tStack_19168.tv_sec = 10;
          tStack_19168.tv_usec = 0;
          fStack_19158.fds_bits[0] = 0;
          fStack_19158.fds_bits[1] = 0;
          fStack_19158.fds_bits[2] = 0;
          fStack_19158.fds_bits[3] = 0;
          fStack_19158.fds_bits[4] = 0;
          fStack_19158.fds_bits[5] = 0;
          fStack_19158.fds_bits[6] = 0;
          fStack_19158.fds_bits[7] = 0;
          fStack_19158.fds_bits[8] = 0;
          fStack_19158.fds_bits[9] = 0;
          fStack_19158.fds_bits[10] = 0;
          fStack_19158.fds_bits[0xb] = 0;
          fStack_19158.fds_bits[0xc] = 0;
          fStack_19158.fds_bits[0xd] = 0;
          fStack_19158.fds_bits[0xe] = 0;
          fStack_19158.fds_bits[0xf] = 0;
          fStack_19158.fds_bits[iVar5 >> 6] =
               fStack_19158.fds_bits[iVar5 >> 6] | 1L << ((byte)__fd & 0x3f);
          uVar11 = libssh2_session_block_directions(lVar6);
          __readfds = (fd_set *)0x0;
          if ((uVar11 & 1) != 0) {
            __readfds = &fStack_19158;
          }
          __writefds = (fd_set *)0x0;
          if ((uVar11 & 2) != 0) {
            __writefds = &fStack_19158;
          }
          select(__fd + 1,__readfds,__writefds,(fd_set *)0x0,&tStack_19168);
          lVar13 = libssh2_channel_write_ex(lVar7,0,__ptr);
        } while (lVar13 == -0x25);
        sStack_19198 = 0;
      }
      if (lVar13 < 0) {
        fprintf(_stderr,"ERROR %ld total %ld / %lu prev %lu\n",lVar13,lStack_191a0,sVar9,
                sStack_19198);
        sVar8 = sVar9;
        break;
      }
      __ptr = __ptr + lVar13;
      sVar8 = sVar9 - lVar13;
      sStack_19198 = sVar9;
    } while (sVar8 != 0);
  } while (sVar8 == 0);
  tVar12 = time((time_t *)0x0);
  iStack_19180 = (int)tVar10;
  uVar4 = (int)tVar12 - iStack_19180;
  fprintf(_stderr,"%ld bytes in %d seconds makes %.1f bytes/sec\n",
          SUB84((double)lStack_191a0 / (double)(int)uVar4,0),lStack_191a0,(ulong)uVar4);
  fwrite("Sending EOF\n",0xc,1,_stderr);
  do {
    iVar5 = libssh2_channel_send_eof(lVar7);
  } while (iVar5 == -0x25);
  fwrite("Waiting for EOF\n",0x10,1,_stderr);
  do {
    iVar5 = libssh2_channel_wait_eof(lVar7);
  } while (iVar5 == -0x25);
  fwrite("Waiting for channel to close\n",0x1d,1,_stderr);
  do {
    iVar5 = libssh2_channel_wait_closed(lVar7);
  } while (iVar5 == -0x25);
  libssh2_channel_free(lVar7);
LAB_00101545:
  if (lVar6 != 0) {
    do {
      iVar5 = libssh2_session_disconnect_ex(lVar6,0xb,"Normal Shutdown","");
    } while (iVar5 == -0x25);
    libssh2_session_free(lVar6);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    FILE *local;
    char mem[1024 * 100];
    size_t nread;
    char *ptr;
    struct stat fileinfo;
    time_t start;
    libssh2_struct_stat_size total = 0;
    int duration;
    size_t prev;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        scppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    stat(loclfile, &fileinfo);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    /* Send a file via scp. The mode parameter must only have permissions! */
    do {
        channel = libssh2_scp_send(session, scppath, fileinfo.st_mode & 0777,
                                   (size_t)fileinfo.st_size);

        if(!channel &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            char *err_msg;

            libssh2_session_last_error(session, &err_msg, NULL, 0);
            fprintf(stderr, "%s\n", err_msg);
            goto shutdown;
        }
    } while(!channel);

    fprintf(stderr, "SCP session waiting to send file\n");
    start = time(NULL);
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        total += (libssh2_struct_stat_size)nread;

        prev = 0;
        do {
            ssize_t nwritten;
            while((nwritten = libssh2_channel_write(channel, ptr, nread)) ==
                  LIBSSH2_ERROR_EAGAIN) {
                waitsocket(sock, session);
                prev = 0;
            }
            if(nwritten < 0) {
                fprintf(stderr, "ERROR %ld total %ld / %lu prev %lu\n",
                        (long)nwritten, (long)total,
                        (unsigned long)nread, (unsigned long)prev);
                break;
            }
            else {
                prev = nread;

                /* nwritten indicates how many bytes were written this time */
                ptr += nwritten;
                nread -= (size_t)nwritten;
            }
        } while(nread);
    } while(!nread); /* only continue if nread was drained */

    duration = (int)(time(NULL) - start);

    fprintf(stderr, "%ld bytes in %d seconds makes %.1f bytes/sec\n",
           (long)total, duration, (double)total / duration);

    fprintf(stderr, "Sending EOF\n");
    while(libssh2_channel_send_eof(channel) == LIBSSH2_ERROR_EAGAIN);

    fprintf(stderr, "Waiting for EOF\n");
    while(libssh2_channel_wait_eof(channel) == LIBSSH2_ERROR_EAGAIN);

    fprintf(stderr, "Waiting for channel to close\n");
    while(libssh2_channel_wait_closed(channel) == LIBSSH2_ERROR_EAGAIN);

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}